

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vertex.h
# Opt level: O0

void __thiscall Assimp::Vertex::Vertex(Vertex *this,aiMesh *msh,uint idx)

{
  float fVar1;
  bool bVar2;
  aiColor4D *paVar3;
  aiVector3D *paVar4;
  aiVector3D *paVar5;
  aiColor4D *paVar6;
  aiColor4t<float> *local_50;
  aiVector3t<float> *local_30;
  uint local_24;
  uint local_20;
  uint i_1;
  uint i;
  uint idx_local;
  aiMesh *msh_local;
  Vertex *this_local;
  
  aiVector3t<float>::aiVector3t(&this->position);
  aiVector3t<float>::aiVector3t(&this->normal);
  aiVector3t<float>::aiVector3t(&this->tangent);
  aiVector3t<float>::aiVector3t(&this->bitangent);
  local_30 = this->texcoords;
  do {
    aiVector3t<float>::aiVector3t(local_30);
    local_30 = local_30 + 1;
  } while ((aiColor4D *)local_30 != this->colors);
  local_50 = this->colors;
  do {
    aiColor4t<float>::aiColor4t(local_50);
    local_50 = local_50 + 1;
  } while ((Vertex *)local_50 != this + 1);
  if (msh->mNumVertices <= idx) {
    __assert_fail("idx < msh->mNumVertices",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/include/assimp/Vertex.h"
                  ,0x71,"Assimp::Vertex::Vertex(const aiMesh *, unsigned int)");
  }
  paVar4 = msh->mVertices + idx;
  fVar1 = paVar4->y;
  (this->position).x = paVar4->x;
  (this->position).y = fVar1;
  (this->position).z = paVar4->z;
  bVar2 = aiMesh::HasNormals(msh);
  if (bVar2) {
    paVar4 = msh->mNormals + idx;
    fVar1 = paVar4->y;
    (this->normal).x = paVar4->x;
    (this->normal).y = fVar1;
    (this->normal).z = paVar4->z;
  }
  bVar2 = aiMesh::HasTangentsAndBitangents(msh);
  if (bVar2) {
    paVar4 = msh->mTangents + idx;
    fVar1 = paVar4->y;
    (this->tangent).x = paVar4->x;
    (this->tangent).y = fVar1;
    (this->tangent).z = paVar4->z;
    paVar4 = msh->mBitangents + idx;
    fVar1 = paVar4->y;
    (this->bitangent).x = paVar4->x;
    (this->bitangent).y = fVar1;
    (this->bitangent).z = paVar4->z;
  }
  local_20 = 0;
  while (bVar2 = aiMesh::HasTextureCoords(msh,local_20), bVar2) {
    paVar5 = msh->mTextureCoords[local_20] + idx;
    paVar4 = this->texcoords + local_20;
    fVar1 = paVar5->y;
    paVar4->x = paVar5->x;
    paVar4->y = fVar1;
    paVar4->z = paVar5->z;
    local_20 = local_20 + 1;
  }
  local_24 = 0;
  while (bVar2 = aiMesh::HasVertexColors(msh,local_24), bVar2) {
    paVar6 = msh->mColors[local_24] + idx;
    paVar3 = this->colors + local_24;
    fVar1 = paVar6->g;
    paVar3->r = paVar6->r;
    paVar3->g = fVar1;
    fVar1 = paVar6->a;
    paVar3->b = paVar6->b;
    paVar3->a = fVar1;
    local_24 = local_24 + 1;
  }
  return;
}

Assistant:

explicit Vertex(const aiMesh* msh, unsigned int idx) {
        ai_assert(idx < msh->mNumVertices);
        position = msh->mVertices[idx];

        if (msh->HasNormals()) {
            normal = msh->mNormals[idx];
        }

        if (msh->HasTangentsAndBitangents()) {
            tangent = msh->mTangents[idx];
            bitangent = msh->mBitangents[idx];
        }

        for (unsigned int i = 0; msh->HasTextureCoords(i); ++i) {
            texcoords[i] = msh->mTextureCoords[i][idx];
        }

        for (unsigned int i = 0; msh->HasVertexColors(i); ++i) {
            colors[i] = msh->mColors[i][idx];
        }
    }